

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O2

int __thiscall
draco::PointCloud::AddAttribute
          (PointCloud *this,GeometryAttribute *att,bool identity_mapping,
          ValueType num_attribute_values)

{
  int iVar1;
  undefined7 in_register_00000011;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> pa;
  unique_ptr<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_> local_18;
  
  CreateAttribute((PointCloud *)&pa,(GeometryAttribute *)this,SUB81(att,0),
                  (ValueType)CONCAT71(in_register_00000011,identity_mapping));
  if ((__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>)
      pa._M_t.
      super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t
      .super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>)0x0) {
    iVar1 = -1;
  }
  else {
    local_18._M_t.
    super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
    .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
          )(__uniq_ptr_data<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>,_true,_true>
            )pa._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
             .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    pa._M_t.
    super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
          )(__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>)0x0;
    iVar1 = AddAttribute(this,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                               *)&local_18);
    std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
              ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
               &local_18);
  }
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            (&pa);
  return iVar1;
}

Assistant:

int PointCloud::AddAttribute(
    const GeometryAttribute &att, bool identity_mapping,
    AttributeValueIndex::ValueType num_attribute_values) {
  auto pa = CreateAttribute(att, identity_mapping, num_attribute_values);
  if (!pa) {
    return -1;
  }
  const int32_t att_id = AddAttribute(std::move(pa));
  return att_id;
}